

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

void prelu(pBox *pbox,mydataFmt *pbias,mydataFmt *prelu_gmma)

{
  int iVar1;
  float *pfVar2;
  ostream *poVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  
  pfVar2 = pbox->pdata;
  if (pfVar2 == (float *)0x0) {
    pcVar5 = "the  pRelu feature is NULL!!";
  }
  else {
    if (pbias != (mydataFmt *)0x0) {
      iVar4 = pbox->height * pbox->width;
      iVar6 = 0;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      iVar7 = pbox->channel;
      if (pbox->channel < 1) {
        iVar7 = 0;
      }
      for (; iVar1 = iVar4, iVar6 != iVar7; iVar6 = iVar6 + 1) {
        while (iVar1 != 0) {
          fVar8 = *pfVar2 + *pbias;
          *pfVar2 = fVar8;
          if (fVar8 <= 0.0) {
            fVar8 = fVar8 * *prelu_gmma;
          }
          *pfVar2 = fVar8;
          pfVar2 = pfVar2 + 1;
          iVar1 = iVar1 + -1;
        }
        pbias = pbias + 1;
        prelu_gmma = prelu_gmma + 1;
      }
      return;
    }
    pcVar5 = "the  pRelu bias is NULL!!";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void prelu(struct pBox *pbox, mydataFmt *pbias, mydataFmt *prelu_gmma) {
    if (pbox->pdata == NULL) {
        cout << "the  pRelu feature is NULL!!" << endl;
        return;
    }
    if (pbias == NULL) {
        cout << "the  pRelu bias is NULL!!" << endl;
        return;
    }
    mydataFmt *op = pbox->pdata;
    mydataFmt *pb = pbias;
    mydataFmt *pg = prelu_gmma;

    long dis = pbox->width * pbox->height;
    for (int channel = 0; channel < pbox->channel; channel++) {
        for (int col = 0; col < dis; col++) {
            *op = *op + *pb;
            *op = (*op > 0) ? (*op) : ((*op) * (*pg));
            op++;
        }
        pb++;
        pg++;
    }
}